

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool __thiscall
cmInstallCommand::HandleScriptMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  cmInstallScriptGenerator *pcVar8;
  cmGlobalGenerator *this_00;
  pointer pbVar9;
  ulong uVar10;
  undefined4 uVar11;
  pointer pbVar12;
  bool bVar13;
  string script;
  string component;
  string local_98;
  undefined4 local_74;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (this->DefaultComponentName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->DefaultComponentName)._M_string_length);
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar11 = 0;
  if (pbVar9 == pbVar12) {
    bVar13 = false;
  }
  else {
    iVar7 = 0;
    uVar10 = 0;
    uVar11 = 0;
    do {
      iVar6 = std::__cxx11::string::compare((char *)(pbVar12 + uVar10));
      if ((iVar6 == 0) &&
         (uVar10 + 1 <
          (ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5))) {
        std::__cxx11::string::_M_assign((string *)&local_70);
        iVar7 = iVar7 + 1;
        uVar10 = uVar10 + 1;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10));
      if (iVar6 == 0) {
        uVar11 = 1;
      }
      uVar10 = uVar10 + 1;
      pbVar12 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar10 < (ulong)((long)pbVar9 - (long)pbVar12 >> 5));
    bVar13 = 1 < iVar7;
  }
  if (bVar13) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,"");
    cmCommand::SetError(&this->super_cmCommand,&local_98);
LAB_001f7c2f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar13 = pbVar12 == pbVar9;
    if (bVar13) {
      bVar3 = false;
      bVar4 = false;
    }
    else {
      bVar4 = false;
      bVar3 = false;
      local_74 = uVar11;
      do {
        iVar7 = std::__cxx11::string::compare((char *)pbVar12);
        if (iVar7 == 0) {
          bVar5 = true;
          bVar3 = false;
          bVar4 = true;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)pbVar12);
          bVar5 = true;
          if (iVar7 == 0) {
            bVar4 = false;
            bVar3 = true;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)pbVar12);
            if (iVar7 == 0) {
              bVar3 = false;
            }
            else {
              if (!bVar4) {
                if (bVar3) {
                  pcVar2 = (this->super_cmCommand).Makefile;
                  pcVar8 = (cmInstallScriptGenerator *)operator_new(0xf0);
                  cmInstallScriptGenerator::cmInstallScriptGenerator
                            (pcVar8,(pbVar12->_M_dataplus)._M_p,true,local_70._M_dataplus._M_p,
                             SUB41(local_74,0));
                  cmMakefile::AddInstallGenerator(pcVar2,(cmInstallGenerator *)pcVar8);
                  bVar3 = false;
                }
                goto LAB_001f7e6d;
              }
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              pcVar1 = (pbVar12->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,pcVar1,pcVar1 + pbVar12->_M_string_length);
              bVar4 = cmsys::SystemTools::FileIsFullPath(&local_98);
              if (!bVar4) {
                cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
                std::__cxx11::string::_M_assign((string *)&local_98);
                std::__cxx11::string::append((char *)&local_98);
                std::__cxx11::string::_M_append
                          ((char *)&local_98,(ulong)(pbVar12->_M_dataplus)._M_p);
              }
              bVar5 = cmsys::SystemTools::FileIsDirectory(&local_98);
              if (bVar5) {
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_50,"given a directory as value of SCRIPT argument.","");
                cmCommand::SetError(&this->super_cmCommand,&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                pcVar2 = (this->super_cmCommand).Makefile;
                pcVar8 = (cmInstallScriptGenerator *)operator_new(0xf0);
                cmInstallScriptGenerator::cmInstallScriptGenerator
                          (pcVar8,local_98._M_dataplus._M_p,false,local_70._M_dataplus._M_p,
                           SUB41(local_74,0));
                cmMakefile::AddInstallGenerator(pcVar2,(cmInstallGenerator *)pcVar8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              bVar5 = !bVar5;
            }
            bVar4 = false;
          }
        }
LAB_001f7e6d:
        if (!bVar5) break;
        pbVar12 = pbVar12 + 1;
        bVar13 = pbVar12 == pbVar9;
      } while (!bVar13);
    }
    if (bVar13) {
      if (bVar4) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"given no value for SCRIPT argument.","");
        cmCommand::SetError(&this->super_cmCommand,&local_98);
      }
      else {
        if (!bVar3) {
          this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          bVar13 = true;
          cmGlobalGenerator::AddInstallComponent(this_00,&local_70);
          goto LAB_001f7ed7;
        }
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"given no value for CODE argument.","");
        cmCommand::SetError(&this->super_cmCommand,&local_98);
      }
      goto LAB_001f7c2f;
    }
  }
  bVar13 = false;
LAB_001f7ed7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar13;
}

Assistant:

bool cmInstallCommand::HandleScriptMode(std::vector<std::string> const& args)
{
  std::string component = this->DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    }
  }

  if (componentCount > 1) {
    this->SetError("given more than one COMPONENT for the SCRIPT or CODE "
                   "signature of the INSTALL command. "
                   "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (std::string const& arg : args) {
    if (arg == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (arg == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (arg == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = arg;
      if (!cmSystemTools::FileIsFullPath(script)) {
        script = this->Makefile->GetCurrentSourceDirectory();
        script += "/";
        script += arg;
      }
      if (cmSystemTools::FileIsDirectory(script)) {
        this->SetError("given a directory as value of SCRIPT argument.");
        return false;
      }
      this->Makefile->AddInstallGenerator(new cmInstallScriptGenerator(
        script.c_str(), false, component.c_str(), exclude_from_all));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = arg;
      this->Makefile->AddInstallGenerator(new cmInstallScriptGenerator(
        code.c_str(), true, component.c_str(), exclude_from_all));
    }
  }

  if (doing_script) {
    this->SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    this->SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}